

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O0

uint * gf_polydiv_recursive(uint *a,uint alen,uint *b,uint blen,uint *new_len)

{
  uint uVar1;
  uint uVar2;
  uint *a_00;
  uint *a_01;
  uint local_64;
  uint *a_new;
  uint local_50;
  uint a_new_len;
  uint i_1;
  uint i;
  uint *g;
  uint q;
  uint *new_len_local;
  uint blen_local;
  uint *b_local;
  uint alen_local;
  uint *a_local;
  
  a_local = a;
  if (blen <= alen) {
    uVar1 = gf_div(a[alen - 1],b[blen - 1]);
    a_00 = vector_new(alen);
    for (a_new_len = 0; a_new_len < alen; a_new_len = a_new_len + 1) {
      if (a_new_len < alen - blen) {
        local_64 = 0;
      }
      else {
        local_64 = b[a_new_len - (alen - blen)];
      }
      a_00[a_new_len] = local_64;
    }
    for (local_50 = 0; local_50 < alen; local_50 = local_50 + 1) {
      uVar2 = gf_mul(a_00[local_50],uVar1);
      a_00[local_50] = uVar2;
      uVar2 = gf_sum(a[local_50],a_00[local_50]);
      a[local_50] = uVar2;
    }
    uVar1 = alen - 1;
    a_01 = submatrix(a,0,uVar1);
    vector_free(a);
    vector_free(a_00);
    if (new_len != (uint *)0x0) {
      *new_len = uVar1;
    }
    a_local = gf_polydiv_recursive(a_01,uVar1,b,blen,new_len);
  }
  return a_local;
}

Assistant:

uint32_t *gf_polydiv_recursive(uint32_t *a, uint32_t alen, uint32_t *b, uint32_t blen, uint32_t *new_len)
{
    if (alen < blen)
        return a;

    uint32_t q = gf_div(a[alen - 1], b[blen - 1]);

    // g = [0,0...0, b[0], b[1], b[n]]
    // alen-blen zeros at the start
    uint32_t *g = vector_new(alen);
    for (uint32_t i = 0; i < alen; i++)
        g[i] = (i < alen - blen) ? 0 : b[i - (alen - blen)];

    for (uint32_t i = 0; i < alen; i++)
    {
        g[i] = gf_mul(g[i], q);
        a[i] = gf_sum(a[i], g[i]);
    }

    uint32_t a_new_len = alen - 1;
    uint32_t *a_new = submatrix(a, 0, a_new_len);

    vector_free(a);
    vector_free(g);

    if (new_len != NULL)
        *new_len = a_new_len;

    return gf_polydiv_recursive(a_new, a_new_len, b, blen, new_len);
}